

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O0

int32_t lj_lib_checkint(lua_State *L,int narg)

{
  int iVar1;
  TValue *o_00;
  bool bVar2;
  int32_t i;
  TValue *o;
  int narg_local;
  lua_State *L_local;
  
  o_00 = L->base + (long)narg + -1;
  if (o_00 < L->top) {
    bVar2 = true;
    if ((0xfffffff2 < (uint)((int)(o_00->field_4).it >> 0xf)) &&
       (bVar2 = false, (int)(o_00->field_4).it >> 0xf == -5)) {
      iVar1 = lj_strscan_num((GCstr *)(o_00->u64 & 0x7fffffffffff),o_00);
      bVar2 = iVar1 != 0;
    }
    if (bVar2) {
      return (int)o_00->n;
    }
  }
  lj_err_argt(L,narg,3);
}

Assistant:

int32_t lj_lib_checkint(lua_State *L, int narg)
{
  TValue *o = L->base + narg-1;
  if (!(o < L->top && lj_strscan_numberobj(o)))
    lj_err_argt(L, narg, LUA_TNUMBER);
  if (LJ_LIKELY(tvisint(o))) {
    return intV(o);
  } else {
    int32_t i = lj_num2int(numV(o));
    if (LJ_DUALNUM) setintV(o, i);
    return i;
  }
}